

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O2

void __thiscall OpenMD::Velocitizer::Velocitizer(Velocitizer *this,SimInfo *info)

{
  this->_vptr_Velocitizer = (_func_int **)&PTR__Velocitizer_002c4378;
  this->info_ = info;
  (this->thermo_).info_ = info;
  this->globals_ = info->simParams_;
  std::__shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>,
             &(info->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

Velocitizer::Velocitizer(SimInfo* info) :
      info_(info), thermo_(info), globals_(info->getSimParams()),
      randNumGen_(info->getRandomNumberGenerator()) {}